

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 soft_f32_sqrt(float32 a,float_status *status)

{
  _Bool _Var1;
  float32 fVar2;
  long lVar3;
  ulong uVar4;
  FloatParts FVar5;
  FloatParts pr;
  FloatParts pa;
  float_status *status_local;
  float32 a_local;
  ulong local_78;
  uint64_t t_frac;
  uint64_t q;
  int last_bit;
  int bit;
  uint64_t s_frac;
  uint64_t r_frac;
  uint64_t a_frac;
  int local_20;
  FloatClass FStack_1c;
  _Bool _Stack_1b;
  undefined2 uStack_1a;
  FloatParts local_18;
  
  FVar5 = float32_unpack_raw(a);
  local_18 = sf_canonicalize(FVar5,&float32_params,status);
  local_78 = local_18.frac;
  local_20 = local_18.exp;
  FStack_1c = local_18.cls;
  _Stack_1b = local_18.sign;
  uStack_1a = local_18._14_2_;
  _Var1 = is_nan(FStack_1c);
  if (_Var1) {
    local_18 = return_nan(local_18,status);
  }
  else if (FStack_1c != float_class_zero) {
    if (((undefined1  [16])local_18 & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
      if (FStack_1c != float_class_inf) {
        if (FStack_1c != float_class_normal) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
        r_frac = local_78;
        if (((undefined1  [16])local_18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          r_frac = local_78 >> 1;
        }
        s_frac = 0;
        _last_bit = 0;
        q._4_4_ = 0x3d;
        do {
          lVar3 = 1L << ((byte)q._4_4_ & 0x3f);
          uVar4 = _last_bit + lVar3;
          if (uVar4 <= r_frac) {
            _last_bit = uVar4 + lVar3;
            r_frac = r_frac - uVar4;
            s_frac = lVar3 + s_frac;
          }
          r_frac = r_frac << 1;
          q._4_4_ = q._4_4_ + -1;
        } while (0x22 < q._4_4_);
        local_18.cls = 2;
        local_18.exp = local_20 >> 1;
        local_18.sign = _Stack_1b;
        local_18._14_2_ = uStack_1a;
        local_18.frac = s_frac * 2 + (long)(int)(uint)(r_frac != 0);
      }
    }
    else {
      status->float_exception_flags = status->float_exception_flags | 1;
      local_18 = parts_default_nan(status);
    }
  }
  FVar5 = round_canonical(local_18,status,&float32_params);
  fVar2 = float32_pack_raw(FVar5);
  return fVar2;
}

Assistant:

static float32 QEMU_SOFTFLOAT_ATTR
soft_f32_sqrt(float32 a, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pr = sqrt_float(pa, status, &float32_params);
    return float32_round_pack_canonical(pr, status);
}